

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugDrawLineExtents(ImU32 col)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  float fVar5;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar3 = GImGui->CurrentWindow;
  fVar1 = (pIVar3->DC).CursorPos.x;
  uVar4 = (ulong)(pIVar3->DC).IsSameLine;
  fVar2 = *(float *)((pIVar3->DC).MenuColumns.Widths + uVar4 * 4 + -0x3d);
  fVar5 = *(float *)((pIVar3->DC).MenuColumns.Widths + uVar4 * 4 + -0x29) + fVar2;
  local_30.x = fVar1 + 5.0;
  local_30.y = fVar2;
  local_28.x = fVar1 + -5.0;
  local_28.y = fVar2;
  ImDrawList::AddLine(pIVar3->DrawList,&local_28,&local_30,col,1.0);
  local_30.x = fVar1 + -0.5;
  local_30.y = fVar5;
  local_28.x = local_30.x;
  local_28.y = fVar2;
  ImDrawList::AddLine(pIVar3->DrawList,&local_28,&local_30,col,1.0);
  local_30.x = fVar1 + 5.0;
  local_30.y = fVar5;
  local_28.x = fVar1 + -5.0;
  local_28.y = fVar5;
  ImDrawList::AddLine(pIVar3->DrawList,&local_28,&local_30,col,1.0);
  return;
}

Assistant:

void ImGui::DebugDrawLineExtents(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float curr_x = window->DC.CursorPos.x;
    float line_y1 = (window->DC.IsSameLine ? window->DC.CursorPosPrevLine.y : window->DC.CursorPos.y);
    float line_y2 = line_y1 + (window->DC.IsSameLine ? window->DC.PrevLineSize.y : window->DC.CurrLineSize.y);
    window->DrawList->AddLine(ImVec2(curr_x - 5.0f, line_y1), ImVec2(curr_x + 5.0f, line_y1), col, 1.0f);
    window->DrawList->AddLine(ImVec2(curr_x - 0.5f, line_y1), ImVec2(curr_x - 0.5f, line_y2), col, 1.0f);
    window->DrawList->AddLine(ImVec2(curr_x - 5.0f, line_y2), ImVec2(curr_x + 5.0f, line_y2), col, 1.0f);
}